

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O1

int ReadWebP(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  int iVar1;
  VP8StatusCode VVar2;
  uint32_t uVar3;
  long *plVar4;
  WebPDemuxer *dmux;
  uint32_t *puVar5;
  long lVar6;
  ulong stride;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  WebPChunkIterator chunk_iter;
  WebPDecoderConfig config;
  WebPData webp_data;
  WebPChunkIterator local_168;
  WebPDecoderConfig local_130;
  WebPData local_40;
  
  uVar7 = 0;
  if (pic != (WebPPicture *)0x0 && (data_size != 0 && data != (uint8_t *)0x0)) {
    iVar1 = WebPInitDecoderConfigInternal(&local_130,0x209);
    uVar7 = 0;
    if (iVar1 == 0) {
      ReadWebP_cold_2();
    }
    else {
      VVar2 = WebPGetFeaturesInternal(data,data_size,&local_130.input,0x209);
      if (VVar2 == VP8_STATUS_OK) {
        bVar9 = keep_alpha != 0;
        bVar10 = local_130.input.has_alpha != 0;
        bVar8 = bVar10 && bVar9;
        pic->width = local_130.input.width;
        pic->height = local_130.input.height;
        if (pic->use_argb == 0) {
          stride = ((ulong)bVar8 * 2 + 3) * (long)local_130.input.width >> 1;
          pic->colorspace = (uint)bVar8 << 2;
        }
        else {
          stride = (long)local_130.input.width << 2;
        }
        iVar1 = ImgIoUtilCheckSizeArgumentsOverflow(stride,(long)local_130.input.height);
        VVar2 = VP8_STATUS_OUT_OF_MEMORY;
        if ((iVar1 == 0) || (iVar1 = WebPPictureAlloc(pic), iVar1 == 0)) {
          bVar8 = false;
        }
        else {
          if (pic->use_argb == 0) {
            local_130.output.colorspace = bVar8 + MODE_YUV;
            local_130.output.u.RGBA.rgba = pic->y;
            local_130.output.u.YUVA.u = pic->u;
            local_130.output.u.RGBA.size = (size_t)pic->v;
            local_130.output.u.YUVA.a_stride = 0;
            if (bVar10 && bVar9) {
              local_130.output.u.YUVA.a = pic->a;
            }
            else {
              local_130.output.u.YUVA.a = (uint8_t *)0x0;
            }
            local_130.output.u.YUVA.y_stride = pic->y_stride;
            local_130.output.u.YUVA.u_stride = pic->uv_stride;
            if (bVar10 && bVar9) {
              local_130.output.u.YUVA.a_stride = pic->a_stride;
            }
            plVar4 = (long *)((long)&local_130.output.u + 0x48);
            iVar1 = pic->height;
            local_130.output.u.YUVA.y_size = (size_t)(local_130.output.u.YUVA.y_stride * iVar1);
            local_130.output.u.YUVA.u_size =
                 (size_t)(((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) *
                         local_130.output.u.YUVA.u_stride);
            iVar1 = iVar1 * pic->a_stride;
            local_130.output.u.YUVA.v_stride = local_130.output.u.YUVA.u_stride;
            local_130.output.u.YUVA.v_size = local_130.output.u.YUVA.u_size;
          }
          else {
            plVar4 = (long *)((long)&local_130.output.u + 0x10);
            local_130.output.colorspace = MODE_BGRA;
            local_130.output.u.RGBA.rgba = (uint8_t *)pic->argb;
            iVar1 = pic->argb_stride * 4;
            local_130.output.u.RGBA.stride = iVar1;
            iVar1 = iVar1 * pic->height;
          }
          *plVar4 = (long)iVar1;
          local_130.output.is_external_memory = 1;
          VVar2 = DecodeWebP(data,data_size,&local_130);
          bVar8 = VVar2 == VP8_STATUS_OK;
          if (((keep_alpha == 0 && VVar2 == VP8_STATUS_OK) && (pic->use_argb != 0)) &&
             (0 < pic->height)) {
            puVar5 = pic->argb;
            iVar1 = 0;
            do {
              if (0 < pic->width) {
                lVar6 = 0;
                do {
                  *(undefined1 *)((long)puVar5 + lVar6 * 4 + 3) = 0xff;
                  lVar6 = lVar6 + 1;
                } while (lVar6 < pic->width);
              }
              puVar5 = puVar5 + pic->argb_stride;
              iVar1 = iVar1 + 1;
            } while (iVar1 < pic->height);
          }
        }
        if (VVar2 == VP8_STATUS_OK) {
          uVar7 = (uint)bVar8;
        }
        else {
          PrintWebPError("input data",VVar2);
          uVar7 = 0;
        }
        WebPFreeDecBuffer(&local_130.output);
        if ((metadata != (Metadata *)0x0) && (uVar7 != 0)) {
          uVar7 = 0;
          local_40.bytes = data;
          local_40.size = data_size;
          dmux = WebPDemuxInternal(&local_40,0,(WebPDemuxState *)0x0,0x107);
          if (dmux != (WebPDemuxer *)0x0) {
            uVar3 = WebPDemuxGetI(dmux,WEBP_FF_FORMAT_FLAGS);
            if (((uVar3 & 0x20) != 0) &&
               (iVar1 = WebPDemuxGetChunk(dmux,"ICCP",1,&local_168), iVar1 != 0)) {
              MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->iccp);
              WebPDemuxReleaseChunkIterator(&local_168);
            }
            if (((uVar3 & 8) != 0) &&
               (iVar1 = WebPDemuxGetChunk(dmux,"EXIF",1,&local_168), iVar1 != 0)) {
              MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->exif);
              WebPDemuxReleaseChunkIterator(&local_168);
            }
            if (((uVar3 & 4) != 0) &&
               (iVar1 = WebPDemuxGetChunk(dmux,"XMP ",1,&local_168), iVar1 != 0)) {
              MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->xmp);
              WebPDemuxReleaseChunkIterator(&local_168);
            }
            WebPDemuxDelete(dmux);
            uVar7 = 1;
          }
          if (dmux == (WebPDemuxer *)0x0) {
            ReadWebP_cold_1();
            uVar7 = 0;
          }
        }
        if (uVar7 == 0) {
          WebPPictureFree(pic);
        }
      }
      else {
        PrintWebPError("input data",VVar2);
      }
    }
  }
  return uVar7;
}

Assistant:

int ReadWebP(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic,
             int keep_alpha, Metadata* const metadata) {
  int ok = 0;
  VP8StatusCode status = VP8_STATUS_OK;
  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    return 0;
  }

  status = WebPGetFeatures(data, data_size, bitstream);
  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    return 0;
  }

  do {
    const int has_alpha = keep_alpha && bitstream->has_alpha;
    uint64_t stride;
    pic->width = bitstream->width;
    pic->height = bitstream->height;
    if (pic->use_argb) {
      stride = (uint64_t)bitstream->width * 4;
    } else {
      stride = (uint64_t)bitstream->width * (has_alpha ? 5 : 3) / 2;
      pic->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
    }

    if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, bitstream->height)) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }

    ok = WebPPictureAlloc(pic);
    if (!ok) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }
    if (pic->use_argb) {
#ifdef WORDS_BIGENDIAN
      output_buffer->colorspace = MODE_ARGB;
#else
      output_buffer->colorspace = MODE_BGRA;
#endif
      output_buffer->u.RGBA.rgba = (uint8_t*)pic->argb;
      output_buffer->u.RGBA.stride = pic->argb_stride * sizeof(uint32_t);
      output_buffer->u.RGBA.size = output_buffer->u.RGBA.stride * pic->height;
    } else {
      output_buffer->colorspace = has_alpha ? MODE_YUVA : MODE_YUV;
      output_buffer->u.YUVA.y = pic->y;
      output_buffer->u.YUVA.u = pic->u;
      output_buffer->u.YUVA.v = pic->v;
      output_buffer->u.YUVA.a = has_alpha ? pic->a : NULL;
      output_buffer->u.YUVA.y_stride = pic->y_stride;
      output_buffer->u.YUVA.u_stride = pic->uv_stride;
      output_buffer->u.YUVA.v_stride = pic->uv_stride;
      output_buffer->u.YUVA.a_stride = has_alpha ? pic->a_stride : 0;
      output_buffer->u.YUVA.y_size = pic->height * pic->y_stride;
      output_buffer->u.YUVA.u_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.v_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.a_size = pic->height * pic->a_stride;
    }
    output_buffer->is_external_memory = 1;

    status = DecodeWebP(data, data_size, &config);
    ok = (status == VP8_STATUS_OK);
    if (ok && !keep_alpha && pic->use_argb) {
      // Need to wipe out the alpha value, as requested.
      int x, y;
      uint32_t* argb = pic->argb;
      for (y = 0; y < pic->height; ++y) {
        for (x = 0; x < pic->width; ++x) argb[x] |= 0xff000000u;
        argb += pic->argb_stride;
      }
    }
  } while (0);   // <- so we can 'break' out of the loop

  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    ok = 0;
  }

  WebPFreeDecBuffer(output_buffer);

  if (ok && metadata != NULL) {
    ok = ExtractMetadata(data, data_size, metadata);
    if (!ok) {
      PrintWebPError("metadata", VP8_STATUS_BITSTREAM_ERROR);
    }
  }
  if (!ok) WebPPictureFree(pic);
  return ok;
}